

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O2

void Io_WriteAiger_old(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols,int fCompact)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  FILE *__stream;
  void *pvVar8;
  Vec_Int_t *vLits;
  Vec_Str_t *p;
  uchar *pBuffer;
  ProgressBar *p_00;
  ulong uVar9;
  uint x;
  char *pcVar10;
  char *pString;
  int iVar11;
  int iVar12;
  uint uVar13;
  char *__format;
  size_t __size;
  uint uVar14;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar15;
  long lVar16;
  bool bVar17;
  int local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteAiger.c"
                  ,0x118,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
  }
  iVar12 = pNtk->nConstrs;
  for (iVar11 = 0; iVar11 < pNtk->vBoxes->nSize; iVar11 = iVar11 + 1) {
    pAVar7 = Abc_NtkBox(pNtk,iVar11);
    if (((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) &&
       (iVar6 = Abc_LatchIsInit0(pAVar7), iVar6 == 0)) {
      if (fCompact != 0) {
        fwrite("Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n"
               ,0x55,1,_stdout);
        return;
      }
      bVar17 = false;
      goto LAB_002e2e14;
    }
  }
  bVar17 = iVar12 == 0;
LAB_002e2e14:
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_6).pTemp = (void *)0x0;
  aVar15 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
    pAVar7 = Abc_NtkCi(pNtk,iVar12);
    pAVar7->field_6 = aVar15;
    aVar15.pTemp = (void *)((long)&(aVar15.pCopy)->pNtk + 1);
  }
  for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
    pAVar7 = Abc_NtkObj(pNtk,iVar12);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar11 = Abc_AigNodeIsAnd(pAVar7), iVar11 != 0)) {
      pvVar8 = aVar15.pTemp & 0xffffffff;
      aVar15._0_4_ = aVar15.iTemp + 1;
      aVar15._4_4_ = 0;
      (pAVar7->field_6).pTemp = pvVar8;
    }
  }
  pcVar10 = "2";
  if (fCompact == 0) {
    pcVar10 = "";
  }
  uVar13 = pNtk->vPis->nSize;
  uVar1 = pNtk->nObjCounts[8];
  iVar12 = pNtk->nObjCounts[7];
  uVar9 = (ulong)(uVar1 + iVar12 + uVar13);
  if (bVar17) {
    fprintf(__stream,"aig%s %u %u %u %u %u",pcVar10,uVar9,(ulong)uVar13,(ulong)uVar1,
            pNtk->vPos->nSize,iVar12);
  }
  else {
    fprintf(__stream,"aig%s %u %u %u %u %u",pcVar10,uVar9,(ulong)uVar13,(ulong)uVar1,0,iVar12);
    fprintf(__stream," %u %u",(ulong)(uint)(pNtk->vPos->nSize - pNtk->nConstrs));
  }
  fputc(10,__stream);
  Abc_NtkInvertConstraints(pNtk);
  if (fCompact == 0) {
    for (iVar12 = 0; iVar12 < pNtk->vBoxes->nSize; iVar12 = iVar12 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar12);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        plVar4 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
        iVar11 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                   (long)*(int *)plVar4[4] * 8) + 0x40);
        uVar9 = (ulong)(((uint)(iVar11 == 0) ^ *(uint *)((long)plVar4 + 0x14) >> 10 & 1) +
                       iVar11 * 2);
        iVar11 = Abc_LatchIsInit0(pAVar7);
        if (iVar11 == 0) {
          iVar11 = Abc_LatchIsInit1(pAVar7);
          if (iVar11 == 0) {
            iVar11 = Abc_LatchIsInitNone(pAVar7);
            if ((iVar11 == 0) && (iVar11 = Abc_LatchIsInitDc(pAVar7), iVar11 == 0)) {
              __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteAiger.c"
                            ,0x156,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
            }
            fprintf(__stream,"%u %u\n",uVar9,
                    (ulong)(uint)(*(int *)((long)pAVar7->pNtk->vObjs->pArray
                                                 [*(pAVar7->vFanouts).pArray] + 0x40) * 2));
            goto LAB_002e337c;
          }
          pcVar10 = "%u 1\n";
        }
        else {
          pcVar10 = "%u\n";
        }
        fprintf(__stream,pcVar10,uVar9);
      }
LAB_002e337c:
    }
    for (iVar12 = 0; iVar12 < pNtk->vPos->nSize; iVar12 = iVar12 + 1) {
      pAVar7 = Abc_NtkPo(pNtk,iVar12);
      iVar11 = *(int *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] + 0x40);
      fprintf(__stream,"%u\n",
              (ulong)(((uint)(iVar11 == 0) ^ *(uint *)&pAVar7->field_0x14 >> 10 & 1) + iVar11 * 2));
    }
  }
  else {
    vLits = Io_WriteAigerLiterals(pNtk);
    p = Io_WriteEncodeLiterals(vLits);
    fwrite(p->pArray,1,(long)p->nSize,__stream);
    Vec_StrFree(p);
    Vec_IntFree(vLits);
  }
  Abc_NtkInvertConstraints(pNtk);
  lVar16 = (long)pNtk->nObjCounts[7] * 6;
  __size = lVar16 + 100;
  pBuffer = (uchar *)malloc(__size);
  p_00 = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  iVar12 = 0;
  iVar11 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar11) {
      local_38 = (int)__size;
      if (local_38 <= iVar12) {
        __assert_fail("Pos < nBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteAiger.c"
                      ,0x186,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
      }
      Extra_ProgressBarStop(p_00);
      fwrite(pBuffer,1,(long)iVar12,__stream);
      free(pBuffer);
      if (fWriteSymbols != 0) {
        for (uVar13 = 0; (int)uVar13 < pNtk->vPis->nSize; uVar13 = uVar13 + 1) {
          pAVar7 = Abc_NtkPi(pNtk,uVar13);
          pcVar10 = Abc_ObjName(pAVar7);
          fprintf(__stream,"i%d %s\n",(ulong)uVar13,pcVar10);
        }
        for (uVar13 = 0; (int)uVar13 < pNtk->vBoxes->nSize; uVar13 = uVar13 + 1) {
          pAVar7 = Abc_NtkBox(pNtk,uVar13);
          if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
            pcVar10 = Abc_ObjName((Abc_Obj_t *)
                                  pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray]);
            fprintf(__stream,"l%d %s\n",(ulong)uVar13,pcVar10);
          }
        }
        for (uVar13 = 0; (int)uVar13 < pNtk->vPos->nSize; uVar13 = uVar13 + 1) {
          pAVar7 = Abc_NtkPo(pNtk,uVar13);
          uVar1 = uVar13;
          if (bVar17) {
            pcVar10 = Abc_ObjName(pAVar7);
            __format = "o%d %s\n";
          }
          else {
            iVar12 = pNtk->vPos->nSize;
            iVar11 = pNtk->nConstrs;
            if ((int)uVar13 < iVar12 - iVar11) {
              pcVar10 = Abc_ObjName(pAVar7);
              __format = "b%d %s\n";
            }
            else {
              pcVar10 = Abc_ObjName(pAVar7);
              __format = "c%d %s\n";
              uVar1 = (iVar11 - iVar12) + uVar13;
            }
          }
          fprintf(__stream,__format,(ulong)uVar1,pcVar10);
        }
      }
      fwrite("c\n",2,1,__stream);
      if ((pNtk->pName != (char *)0x0) && (*pNtk->pName != '\0')) {
        fprintf(__stream,".model %s\n");
      }
      pcVar10 = Extra_TimeStamp();
      fprintf(__stream,"This file was produced by ABC on %s\n",pcVar10);
      fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger"
             );
LAB_002e343d:
      fclose(__stream);
      return;
    }
    pAVar7 = Abc_NtkObj(pNtk,iVar11);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar6 = Abc_AigNodeIsAnd(pAVar7), iVar6 != 0)) {
      Extra_ProgressBarUpdate(p_00,iVar11,pString);
      uVar5 = (pAVar7->field_6).iTemp * 2;
      ppvVar2 = pAVar7->pNtk->vObjs->pArray;
      piVar3 = (pAVar7->vFanins).pArray;
      uVar13 = (*(uint *)&pAVar7->field_0x14 >> 10 & 1) +
               *(int *)((long)ppvVar2[*piVar3] + 0x40) * 2;
      uVar1 = (*(uint *)&pAVar7->field_0x14 >> 0xb & 1) +
              *(int *)((long)ppvVar2[piVar3[1]] + 0x40) * 2;
      uVar14 = uVar1;
      if (uVar1 < uVar13) {
        uVar14 = uVar13;
      }
      x = uVar5 - uVar14;
      if (uVar5 < uVar14 || x == 0) {
        __assert_fail("uLit1 < uLit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteAiger.c"
                      ,0x17c,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
      }
      if (uVar13 < uVar1) {
        uVar1 = uVar13;
      }
      iVar12 = Io_WriteAigerEncode(pBuffer,iVar12,x);
      iVar12 = Io_WriteAigerEncode(pBuffer,iVar12,uVar14 - uVar1);
      if ((int)lVar16 + 0x5a < iVar12) {
        puts(
            "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
            );
        goto LAB_002e343d;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void Io_WriteAiger_old( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols, int fCompact )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, nBufferSize, Pos, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    fExtended = Abc_NtkConstrNum(pNtk);

    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( !Abc_LatchIsInit0(pObj) )
        {
            if ( !fCompact )
            {
                fExtended = 1;
                break;
            }
            fprintf( stdout, "Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
        Abc_NtkPiNum(pNtk),
        Abc_NtkLatchNum(pNtk),
        fExtended ? 0 : Abc_NtkPoNum(pNtk),
        Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        fprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    fprintf( pFile, "\n" );

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Abc_NtkInvertConstraints( pNtk );
    if ( !fCompact ) 
    {
        // write latch drivers
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pObj = Abc_ObjFanin0(pLatch);
            pDriver = Abc_ObjFanin0(pObj);
            uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
            if ( Abc_LatchIsInit0(pLatch) )
                fprintf( pFile, "%u\n", uLit );
            else if ( Abc_LatchIsInit1(pLatch) )
                fprintf( pFile, "%u 1\n", uLit );
            else
            {
                // Both None and DC are written as 'uninitialized' e.g. a free boolean value
                assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
                fprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
            }
        }
        // write PO drivers
        Abc_NtkForEachPo( pNtk, pObj, i )
        {
            pDriver = Abc_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Io_WriteAigerLiterals( pNtk );
        Vec_Str_t * vBinary = Io_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit  - uLit1) );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit1 - uLit0) );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                fprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                fprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    fprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        fprintf( pFile, ".model %s\n", pNtk->pName );
    fprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}